

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_tests.cpp
# Opt level: O3

void wallet::init_tests::walletinit_verify_walletdir_no_trailing_invoker(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  unit_test_log_t *puVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  walletinit_verify_walletdir_no_trailing t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  undefined1 local_6b0 [112];
  ios_base local_640 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  undefined1 local_518 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0 [26];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_6c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_6b8 = "";
  memset((ostringstream *)local_518,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_518);
  local_3a0[0]._M_string_length = 0;
  local_3a0[0].field_2._M_local_buf[0] = '\0';
  local_6b0[0] = (ostringstream)0x22;
  local_3a0[0]._M_dataplus._M_p = (pointer)&local_3a0[0].field_2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_518,local_6b0,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_518,"walletinit_verify_walletdir_no_trailing",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_518,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_3a0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b0);
  if ((undefined1 *)CONCAT71(local_6b0._1_7_,local_6b0[0]) != local_6b0 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_6b0._1_7_,local_6b0[0]),local_6b0._16_8_ + 1);
  }
  local_6d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0[0]._M_dataplus._M_p;
  local_6c8 = local_3a0[0]._M_dataplus._M_p + local_3a0[0]._M_string_length;
  file.m_end = (iterator)0x42;
  file.m_begin = (iterator)&local_6c0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file,(size_t)&local_6d0,msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0[0]._M_dataplus._M_p != &local_3a0[0].field_2) {
    operator_delete(local_3a0[0]._M_dataplus._M_p,
                    CONCAT71(local_3a0[0].field_2._M_allocated_capacity._1_7_,
                             local_3a0[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_518);
  std::ios_base::~ios_base((ios_base *)(local_518 + 0x70));
  InitWalletDirTestingSetup::InitWalletDirTestingSetup((InitWalletDirTestingSetup *)local_518,MAIN);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_6d8 = "";
  memset((ostringstream *)local_6b0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6b0);
  paVar1 = &local_538.field_2;
  local_538._M_string_length = 0;
  local_538.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_538._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6b0,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_6b0,"walletinit_verify_walletdir_no_trailing",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6b0,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_538,&local_58);
  paVar2 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_6f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p;
  local_6e8 = local_538._M_dataplus._M_p + local_538._M_string_length;
  file_00.m_end = (iterator)0x42;
  file_00.m_begin = (iterator)&local_6e0;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_00,(size_t)&local_6f0,msg_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != paVar1) {
    operator_delete(local_538._M_dataplus._M_p,
                    CONCAT71(local_538.field_2._M_allocated_capacity._1_7_,
                             local_538.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6b0);
  std::ios_base::~ios_base(local_640);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_700 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_6f8 = "";
  memset((ostringstream *)local_6b0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6b0);
  local_538._M_string_length = 0;
  local_538.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_538._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6b0,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_6b0,"walletinit_verify_walletdir_no_trailing",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6b0,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_538,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_710 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p;
  local_708 = local_538._M_dataplus._M_p + local_538._M_string_length;
  file_01.m_end = (iterator)0x42;
  file_01.m_begin = (iterator)&local_700;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_01,(size_t)&local_710,msg_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != paVar1) {
    operator_delete(local_538._M_dataplus._M_p,
                    CONCAT71(local_538.field_2._M_allocated_capacity._1_7_,
                             local_538.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6b0);
  std::ios_base::~ios_base(local_640);
  walletinit_verify_walletdir_no_trailing::test_method
            ((walletinit_verify_walletdir_no_trailing *)local_518);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_720 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_718 = "";
  memset((ostringstream *)local_6b0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6b0);
  local_538._M_string_length = 0;
  local_538.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_538._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6b0,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_6b0,"walletinit_verify_walletdir_no_trailing",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_6b0,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_538,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_730 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p;
  local_728 = local_538._M_dataplus._M_p + local_538._M_string_length;
  file_02.m_end = (iterator)0x42;
  file_02.m_begin = (iterator)&local_720;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_02,(size_t)&local_730,msg_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != paVar1) {
    operator_delete(local_538._M_dataplus._M_p,
                    CONCAT71(local_538.field_2._M_allocated_capacity._1_7_,
                             local_538.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6b0);
  std::ios_base::~ios_base(local_640);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_740 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_738 = "";
  memset((ostringstream *)local_6b0,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6b0);
  local_538._M_string_length = 0;
  local_538.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_538._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6b0,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_6b0,"walletinit_verify_walletdir_no_trailing",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_6b0,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_538,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_750 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_538._M_dataplus._M_p;
  local_748 = local_538._M_dataplus._M_p + local_538._M_string_length;
  file_03.m_end = (iterator)0x42;
  file_03.m_begin = (iterator)&local_740;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_03,(size_t)&local_750,msg_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != paVar1) {
    operator_delete(local_538._M_dataplus._M_p,
                    CONCAT71(local_538.field_2._M_allocated_capacity._1_7_,
                             local_538.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6b0);
  std::ios_base::~ios_base(local_640);
  InitWalletDirTestingSetup::~InitWalletDirTestingSetup((InitWalletDirTestingSetup *)local_518);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(walletinit_verify_walletdir_no_trailing)
{
    SetWalletDir(m_walletdir_path_cases["trailing"]);
    bool result = m_wallet_loader->verify();
    BOOST_CHECK(result == true);
    fs::path walletdir = m_args.GetPathArg("-walletdir");
    fs::path expected_path = fs::canonical(m_walletdir_path_cases["default"]);
    BOOST_CHECK_EQUAL(walletdir, expected_path);
}